

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_done(connectdata **connp,CURLcode status,_Bool premature)

{
  connectdata *conn;
  SessionHandle *data;
  Curl_done_func p_Var1;
  int iVar2;
  ulong uVar3;
  connectdata *conn_00;
  connectdata *pcVar4;
  
  conn = *connp;
  data = conn->data;
  if ((data->state).done == false) {
    Curl_getoff_all_pipelines(data,conn);
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    (*Curl_cfree)((data->req).location);
    (data->req).location = (char *)0x0;
    if ((status < CURLE_BAD_FUNCTION_ARGUMENT) &&
       ((0x40004800000U >> ((ulong)status & 0x3f) & 1) != 0)) {
      premature = true;
    }
    p_Var1 = conn->handler->done;
    if (p_Var1 != (Curl_done_func)0x0) {
      status = (*p_Var1)(conn,status,premature);
    }
    if (status == CURLE_OK) {
      iVar2 = Curl_pgrsDone(conn);
      status = CURLE_ABORTED_BY_CALLBACK;
      if (iVar2 == 0) {
        status = CURLE_OK;
      }
    }
    if (((conn->send_pipe->size + conn->recv_pipe->size == 0) || ((data->set).reuse_forbid != false)
        ) || ((conn->bits).close == true)) {
      (data->state).done = true;
      if (conn->dns_entry != (Curl_dns_entry *)0x0) {
        Curl_resolv_unlock(data,conn->dns_entry);
        conn->dns_entry = (Curl_dns_entry *)0x0;
      }
      (*Curl_cfree)((data->state).tempwrite);
      (data->state).tempwrite = (char *)0x0;
      if (((data->set).reuse_forbid == false) && ((premature | (conn->bits).close) != 1)) {
        uVar3 = data->multi->maxconnects;
        if ((long)uVar3 < 0) {
          uVar3 = (long)data->multi->num_easy << 2;
        }
        conn->inuse = false;
        if ((uVar3 == 0) || (((data->state).conn_cache)->num_connections <= uVar3)) {
          pcVar4 = (connectdata *)0x0;
        }
        else {
          Curl_infof(data,"Connection cache is full, closing the oldest one.\n");
          conn_00 = find_oldest_idle_connection(data);
          pcVar4 = (connectdata *)0x0;
          if (conn_00 != (connectdata *)0x0) {
            conn_00->data = data;
            Curl_disconnect(conn_00,false);
            pcVar4 = conn_00;
          }
        }
        if (pcVar4 == conn) {
          (data->state).lastconnect = (connectdata *)0x0;
        }
        else {
          (data->state).lastconnect = conn;
          Curl_infof(data,"Connection #%ld to host %s left intact\n",conn->connection_id,
                     *(undefined8 *)
                      (conn->primary_ip + (ulong)(conn->bits).httpproxy * 0x20 + -0x34));
        }
      }
      else {
        Curl_disconnect(conn,premature);
      }
      *connp = (connectdata *)0x0;
      (*Curl_cfree)((data->req).protop);
      (data->req).protop = (void *)0x0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      return status;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_done(struct connectdata **connp,
                   CURLcode status,  /* an error if this is called after an
                                        error was detected */
                   bool premature)
{
  CURLcode result;
  struct connectdata *conn;
  struct SessionHandle *data;

  DEBUGASSERT(*connp);

  conn = *connp;
  data = conn->data;

  DEBUGF(infof(data, "Curl_done\n"));

  if(data->state.done)
    /* Stop if Curl_done() has already been called */
    return CURLE_OK;

  Curl_getoff_all_pipelines(data, conn);

  /* Cleanup possible redirect junk */
  free(data->req.newurl);
  data->req.newurl = NULL;
  free(data->req.location);
  data->req.location = NULL;

  switch(status) {
  case CURLE_ABORTED_BY_CALLBACK:
  case CURLE_READ_ERROR:
  case CURLE_WRITE_ERROR:
    /* When we're aborted due to a callback return code it basically have to
       be counted as premature as there is trouble ahead if we don't. We have
       many callbacks and protocols work differently, we could potentially do
       this more fine-grained in the future. */
    premature = TRUE;
  default:
    break;
  }

  /* this calls the protocol-specific function pointer previously set */
  if(conn->handler->done)
    result = conn->handler->done(conn, status, premature);
  else
    result = status;

  if(!result && Curl_pgrsDone(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  if((conn->send_pipe->size + conn->recv_pipe->size != 0 &&
      !data->set.reuse_forbid &&
      !conn->bits.close)) {
    /* Stop if pipeline is not empty and we do not have to close
       connection. */
    DEBUGF(infof(data, "Connection still in use, no more Curl_done now!\n"));
    return CURLE_OK;
  }

  data->state.done = TRUE; /* called just now! */
  Curl_resolver_cancel(conn);

  if(conn->dns_entry) {
    Curl_resolv_unlock(data, conn->dns_entry); /* done with this */
    conn->dns_entry = NULL;
  }

  /* if the transfer was completed in a paused state there can be buffered
     data left to write and then kill */
  free(data->state.tempwrite);
  data->state.tempwrite = NULL;

  /* if data->set.reuse_forbid is TRUE, it means the libcurl client has
     forced us to close this connection. This is ignored for requests taking
     place in a NTLM authentication handshake

     if conn->bits.close is TRUE, it means that the connection should be
     closed in spite of all our efforts to be nice, due to protocol
     restrictions in our or the server's end

     if premature is TRUE, it means this connection was said to be DONE before
     the entire request operation is complete and thus we can't know in what
     state it is for re-using, so we're forced to close it. In a perfect world
     we can add code that keep track of if we really must close it here or not,
     but currently we have no such detail knowledge.
  */

  if((data->set.reuse_forbid
#if defined(USE_NTLM)
      && !(conn->ntlm.state == NTLMSTATE_TYPE2 ||
           conn->proxyntlm.state == NTLMSTATE_TYPE2)
#endif
     ) || conn->bits.close || premature) {
    CURLcode res2 = Curl_disconnect(conn, premature); /* close connection */

    /* If we had an error already, make sure we return that one. But
       if we got a new error, return that. */
    if(!result && res2)
      result = res2;
  }
  else {
    /* the connection is no longer in use */
    if(ConnectionDone(data, conn)) {
      /* remember the most recently used connection */
      data->state.lastconnect = conn;

      infof(data, "Connection #%ld to host %s left intact\n",
            conn->connection_id,
            conn->bits.httpproxy?conn->proxy.dispname:conn->host.dispname);
    }
    else
      data->state.lastconnect = NULL;
  }

  *connp = NULL; /* to make the caller of this function better detect that
                    this was either closed or handed over to the connection
                    cache here, and therefore cannot be used from this point on
                 */
  Curl_free_request_state(data);

  return result;
}